

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

bool __thiscall MakefileGenerator::canExecute(MakefileGenerator *this,QStringList *cmdline,int *a)

{
  bool bVar1;
  byte bVar2;
  QString *file;
  qsizetype qVar3;
  const_reference pQVar4;
  int *in_RDX;
  QList<QString> *in_RSI;
  MakefileGenerator *in_RDI;
  long in_FS_OFFSET;
  int i;
  int argv0;
  QString c;
  undefined4 in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff6c;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  int local_68;
  int local_64;
  byte local_41;
  QChar local_a;
  long local_8;
  QChar c_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_64 = -1;
  local_68 = 0;
  while( true ) {
    file = (QString *)(long)local_68;
    qVar3 = QList<QString>::size(in_RSI);
    if (qVar3 <= (long)file) break;
    pQVar4 = QList<QString>::at((QList<QString> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  in_stack_ffffffffffffff70)),
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    c_00.ucs = (char16_t)((ulong)pQVar4 >> 0x30);
    QChar::QChar<char,_true>(&local_a,'=');
    bVar1 = QString::contains((QString *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ),c_00,in_stack_ffffffffffffff6c);
    if (!bVar1) {
      local_64 = local_68;
      break;
    }
    local_68 = local_68 + 1;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = local_64;
  }
  if (local_64 != -1) {
    QList<QString>::at((QList<QString> *)
                       CONCAT17(in_stack_ffffffffffffff77,
                                CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Option::normalizePath
              ((QString *)in_RDI,SUB81((ulong)file >> 0x38,0),SUB81((ulong)file >> 0x30,0));
    QString::QString((QString *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                     (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar2 = exists(in_RDI,file);
    QString::~QString((QString *)0x173af4);
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      local_41 = 1;
    }
    QString::~QString((QString *)0x173b1f);
    if (bVar1) goto LAB_00173b32;
  }
  local_41 = 0;
LAB_00173b32:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool MakefileGenerator::canExecute(const QStringList &cmdline, int *a) const
{
    int argv0 = -1;
    for(int i = 0; i < cmdline.size(); ++i) {
        if(!cmdline.at(i).contains('=')) {
            argv0 = i;
            break;
        }
    }
    if(a)
        *a = argv0;
    if(argv0 != -1) {
        const QString c = Option::normalizePath(cmdline.at(argv0));
        if(exists(c))
            return true;
    }
    return false;
}